

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.cc
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  allocator local_49;
  string local_48;
  
  for (lVar1 = 1; lVar1 < argc; lVar1 = lVar1 + 1) {
    std::__cxx11::string::string((string *)&local_48,argv[lVar1],&local_49);
    unzip(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  int rv = 0;
  for (int i = 1; i < argc; i++) {
    rv = unzip(argv[i]);
    if (rv != 0) {
      return rv;
    }
  }
  return rv;
}